

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

result * __thiscall
lest::expression_lhs<void(S::*const&)()>::operator==
          (result *__return_storage_ptr__,expression_lhs<void(S::*const&)()> *this,
          offset_in_S_to_subr *rhs)

{
  lest *this_00;
  offset_in_S_to_subr oVar1;
  offset_in_S_to_subr oVar2;
  offset_in_S_to_subr oVar3;
  offset_in_S_to_subr oVar4;
  result *prVar5;
  offset_in_S_to_subr *in_R8;
  allocator local_e1;
  undefined1 *local_e0;
  undefined8 local_d8;
  undefined1 local_d0 [8];
  undefined8 uStack_c8;
  string local_c0;
  result *local_a0;
  undefined1 *local_98;
  undefined8 local_90;
  undefined1 local_88 [8];
  undefined8 uStack_80;
  char *local_78;
  size_type local_70;
  char local_68 [8];
  undefined8 uStack_60;
  undefined1 local_58 [40];
  
  this_00 = *(lest **)this;
  oVar1 = *(offset_in_S_to_subr *)this_00;
  oVar2 = *(offset_in_S_to_subr *)(this_00 + 8);
  oVar3 = *rhs;
  oVar4 = rhs[1];
  local_a0 = __return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_e0,"==",&local_e1);
  local_98 = local_88;
  if (local_e0 == local_d0) {
    uStack_80 = uStack_c8;
  }
  else {
    local_98 = local_e0;
  }
  local_90 = local_d8;
  local_d8 = 0;
  local_d0[0] = 0;
  local_e0 = local_d0;
  to_string<void(S::*)(),void(S::*)()>
            (&local_c0,this_00,(offset_in_S_to_subr *)&local_98,(string *)rhs,in_R8);
  local_70 = local_c0._M_string_length;
  local_58[0] = oVar1 == oVar3 && (oVar1 == 0 || oVar2 == oVar4);
  local_78 = local_68;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p == &local_c0.field_2) {
    uStack_60 = local_c0.field_2._8_8_;
  }
  else {
    local_78 = local_c0._M_dataplus._M_p;
  }
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::string((string *)(local_58 + 8),(string *)&local_78);
  prVar5 = local_a0;
  result::result(local_a0,(result *)local_58);
  std::__cxx11::string::~string((string *)(local_58 + 8));
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_e0);
  return prVar5;
}

Assistant:

result operator<=( R const & rhs ) { return result( lhs <= rhs, to_string( lhs, "<=", rhs ) ); }